

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void load_variable(ch_compilation *comp,ch_lexeme name)

{
  ch_scope *scope;
  undefined1 uVar1;
  _Bool _Var2;
  undefined4 in_EAX;
  ch_dataptr value;
  size_t write_size;
  ch_emit_scope *blob;
  uint8_t offset;
  ch_op op;
  undefined4 uStack_28;
  undefined4 local_24;
  
  scope = comp->scope;
  uStack_28 = in_EAX;
  _Var2 = scope_lookup(scope,name,(uint8_t *)((long)&uStack_28 + 3));
  if (_Var2) {
    _uStack_28 = CONCAT44(0x11,uStack_28);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_24,1);
    value = (ch_dataptr)uStack_28._3_1_;
  }
  else {
    _Var2 = upvalue_lookup(comp,scope,name,(uint8_t *)((long)&uStack_28 + 3));
    if (_Var2) {
      _uStack_28 = CONCAT44(0x13,uStack_28);
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_24,1);
      uVar1 = uStack_28._3_1_;
      _uStack_28 = CONCAT14(uVar1,uStack_28);
      blob = (comp->emit).emit_scope;
      write_size = 1;
      goto LAB_0010428e;
    }
    _uStack_28 = CONCAT44(0x18,uStack_28);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_24,1);
    value = emit_string(comp,name.start,name.size);
  }
  ch_uint32_to_le_array(value,(uint8_t *)&local_24);
  blob = (comp->emit).emit_scope;
  write_size = 4;
LAB_0010428e:
  ch_emit_write(&blob->bytecode,&local_24,write_size);
  return;
}

Assistant:

void load_variable(ch_compilation *comp, ch_lexeme name) {
  uint8_t offset;

  if (scope_lookup(comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_LOCAL);
    EMIT_PTR(GET_EMIT(comp), offset);
  } else if(upvalue_lookup(comp, comp->scope, name, &offset)) {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_UPVALUE);
    EMIT_ARGCOUNT(GET_EMIT(comp), offset);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_LOAD_GLOBAL);
    ch_dataptr string_ptr = emit_string(comp, name.start, name.size);
    EMIT_PTR(GET_EMIT(comp), string_ptr);
  }
}